

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaL_loadfile(lua_State *L,char *filename)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  FILE *__stream_00;
  int idx;
  char *pcVar3;
  bool bVar4;
  LoadF lf;
  
  idx = (int)((ulong)((long)L->top - (long)L->base) >> 4) + 1;
  lf.extraline = 0;
  if (filename == (char *)0x0) {
    lua_pushlstring(L,"=stdin",6);
    __stream_00 = _stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    __stream_00 = fopen(filename,"r");
    if (__stream_00 == (FILE *)0x0) {
      pcVar3 = "open";
      lf.f = (FILE *)__stream_00;
      goto LAB_00103ad7;
    }
  }
  lf.f = (FILE *)__stream_00;
  iVar1 = getc(__stream_00);
  if (iVar1 == 0x23) {
    iVar1 = -1;
    lf.extraline = 1;
    do {
      iVar2 = getc(__stream_00);
      if (iVar2 == 10) {
        iVar1 = getc(__stream_00);
        goto LAB_00103a0a;
      }
    } while (iVar2 != -1);
    bVar4 = filename != (char *)0x0;
  }
  else {
LAB_00103a0a:
    bVar4 = filename != (char *)0x0;
    if (bVar4 && iVar1 == 0x1b) {
      __stream_00 = freopen(filename,"rb",__stream_00);
      lf.f = (FILE *)__stream_00;
      if (__stream_00 == (FILE *)0x0) {
        pcVar3 = "reopen";
        goto LAB_00103ad7;
      }
      do {
        iVar1 = getc(__stream_00);
        if (iVar1 == 0x1b) break;
      } while (iVar1 != -1);
      lf.extraline = 0;
      bVar4 = true;
    }
  }
  ungetc(iVar1,__stream_00);
  pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar1 = lua_load(L,getF,&lf,pcVar3);
  __stream = lf.f;
  iVar2 = ferror((FILE *)lf.f);
  if (bVar4) {
    fclose((FILE *)__stream);
  }
  if (iVar2 == 0) {
    lua_remove(L,idx);
    return iVar1;
  }
  lua_settop(L,idx);
  pcVar3 = "read";
LAB_00103ad7:
  errfile(L,pcVar3,idx);
  return 6;
}

Assistant:

static int luaL_loadfile(lua_State*L,const char*filename){
LoadF lf;
int status,readstatus;
int c;
int fnameindex=lua_gettop(L)+1;
lf.extraline=0;
if(filename==NULL){
lua_pushliteral(L,"=stdin");
lf.f=stdin;
}
else{
lua_pushfstring(L,"@%s",filename);
lf.f=fopen(filename,"r");
if(lf.f==NULL)return errfile(L,"open",fnameindex);
}
c=getc(lf.f);
if(c=='#'){
lf.extraline=1;
while((c=getc(lf.f))!=EOF&&c!='\n');
if(c=='\n')c=getc(lf.f);
}
if(c=="\033Lua"[0]&&filename){
lf.f=freopen(filename,"rb",lf.f);
if(lf.f==NULL)return errfile(L,"reopen",fnameindex);
while((c=getc(lf.f))!=EOF&&c!="\033Lua"[0]);
lf.extraline=0;
}
ungetc(c,lf.f);
status=lua_load(L,getF,&lf,lua_tostring(L,-1));
readstatus=ferror(lf.f);
if(filename)fclose(lf.f);
if(readstatus){
lua_settop(L,fnameindex);
return errfile(L,"read",fnameindex);
}
lua_remove(L,fnameindex);
return status;
}